

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_exec(int nargs,char **args)

{
  char cVar1;
  __pid_t __pid;
  uint uVar2;
  int __status;
  bool bVar3;
  int status;
  undefined8 local_128;
  
  if (*args[(long)nargs + -1] == '&') {
    cVar1 = args[(long)nargs + -1][1];
    bVar3 = cVar1 == '\0';
    __pid = fork();
    if (__pid == 0) {
LAB_001048ff:
      memset(&local_128,0,0x100);
      memcpy(&local_128,args + 1,(long)(int)(~(uint)bVar3 + nargs) << 3);
      __status = execv((char *)CONCAT44(local_128._4_4_,(uint)local_128),(char **)&local_128);
      _exit(__status);
    }
    if (cVar1 == '\0') {
      return 0;
    }
  }
  else {
    __pid = fork();
    if (__pid == 0) {
      bVar3 = false;
      goto LAB_001048ff;
    }
  }
  waitpid(__pid,(int *)&local_128,0);
  uVar2 = 1;
  if (((uint)local_128 & 0x7f) == 0) {
    uVar2 = (uint)local_128 >> 8 & 0xff;
  }
  return uVar2;
}

Assistant:

int do_exec(int nargs, char **args)
{
    int ret, status, background = 0;
    char *ptrs[32];

    if(!strcmp(args[nargs-1], "&")) {
        background = 1;
        --nargs;
    }
    ret = fork();
    if (ret) {
        if (!background) {
            waitpid(ret, &status, 0);
            if (WIFEXITED(status))
                return WEXITSTATUS(status);
            else
               return 1;
        }
        return 0;
    }

    memset(ptrs, 0, sizeof(ptrs));
    memcpy(ptrs, &args[1], (nargs-1)*sizeof(char*));
    ret = execv(ptrs[0], ptrs);
    _exit(ret);
}